

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

int precedence(string *token)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)token);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)token);
    iVar1 = 2;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)token);
      if (iVar2 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)token);
        if (iVar1 == 0) {
          iVar1 = 3;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)token);
          iVar1 = (uint)(iVar1 == 0) * 3;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int precedence(string token) {
   if (token == "=") return 1;
   if (token == "+" || token == "-") return 2;
   if (token == "*" || token == "/") return 3;
   return 0;
}